

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

void Acb_NtkWindowUndo(Acb_Ntk_t *p,Vec_Int_t *vWin)

{
  int iVar1;
  int iVar2;
  int local_1c;
  int iObj;
  int i;
  Vec_Int_t *vWin_local;
  Acb_Ntk_t *p_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vWin);
    if (iVar1 <= local_1c) {
      return;
    }
    iVar1 = Vec_IntEntry(vWin,local_1c);
    iVar2 = Abc_Lit2Var(iVar1);
    iVar2 = Vec_IntEntry(&p->vObjFunc,iVar2);
    if (iVar2 == -1) break;
    iVar1 = Abc_Lit2Var(iVar1);
    Vec_IntWriteEntry(&p->vObjFunc,iVar1,-1);
    local_1c = local_1c + 1;
  }
  __assert_fail("Vec_IntEntry(&p->vObjFunc, Abc_Lit2Var(iObj)) != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                ,0x11a,"void Acb_NtkWindowUndo(Acb_Ntk_t *, Vec_Int_t *)");
}

Assistant:

void Acb_NtkWindowUndo( Acb_Ntk_t * p, Vec_Int_t * vWin )
{
    int i, iObj;
    Vec_IntForEachEntry( vWin, iObj, i )
    {
        assert( Vec_IntEntry(&p->vObjFunc, Abc_Lit2Var(iObj)) != -1 );
        Vec_IntWriteEntry( &p->vObjFunc, Abc_Lit2Var(iObj), -1 );
    }
}